

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_23de0c::PulseCapture::open(PulseCapture *this,char *__file,int __oflag,...)

{
  ALCdevice *pAVar1;
  bool bVar2;
  ALuint AVar3;
  int iVar4;
  uint uVar5;
  int extraout_EAX;
  pointer pDVar6;
  pa_context *ppVar7;
  pa_sample_spec *spec;
  backend_exception *pbVar8;
  ALCchar *pAVar9;
  backend_exception *pbVar10;
  pa_stream *ppVar11;
  char *pcVar12;
  ulong uVar13;
  undefined8 uVar14;
  pa_operation *op;
  pa_stream_flags_t flags;
  ALuint samples;
  ALuint frame_size;
  pa_channel_map chanmap;
  unique_lock<std::mutex> plock;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  iter;
  char *pulse_name;
  PulseMainloop *in_stack_fffffffffffffe18;
  pa_stream_flags_t rhs;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  *in_stack_fffffffffffffe20;
  unique_lock<std::mutex> *plock_00;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 uVar15;
  undefined4 in_stack_fffffffffffffe2c;
  vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  *in_stack_fffffffffffffe30;
  anon_class_8_1_898f2789_for__M_pred in_stack_fffffffffffffe38;
  code *pcVar16;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  in_stack_fffffffffffffe40;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  in_stack_fffffffffffffe48;
  pa_channel_map *in_stack_fffffffffffffe58;
  char *pcVar17;
  ALCdevice *in_stack_fffffffffffffe60;
  pa_buffer_attr *in_stack_fffffffffffffe98;
  pa_stream_flags_t flags_00;
  unique_lock<std::mutex> *in_stack_fffffffffffffea8;
  PulseMainloop *in_stack_fffffffffffffeb0;
  PulseMainloop *in_stack_fffffffffffffec0;
  PulseMainloop *pPVar18;
  pa_channel_map *chanmap_00;
  BackendType type;
  unique_lock<std::mutex> local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  undefined1 local_60 [32];
  DevMap *local_40;
  char *local_38;
  DevMap *local_30;
  DevMap *local_28;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  local_20;
  char *local_18;
  char *local_10;
  PulseCapture *local_8;
  
  local_18 = (char *)0x0;
  local_10 = __file;
  local_8 = this;
  if (__file != (char *)0x0) {
    bVar2 = std::
            vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
            ::empty(in_stack_fffffffffffffe30);
    if (bVar2) {
      PulseMainloop::probeCaptureDevices(in_stack_fffffffffffffec0);
    }
    local_28 = (DevMap *)
               std::
               vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
               ::cbegin((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                         *)in_stack_fffffffffffffe18);
    local_30 = (DevMap *)
               std::
               vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
               ::cend((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                       *)in_stack_fffffffffffffe18);
    local_38 = local_10;
    local_20 = std::
               find_if<__gnu_cxx::__normal_iterator<(anonymous_namespace)::DevMap_const*,std::vector<(anonymous_namespace)::DevMap,al::allocator<(anonymous_namespace)::DevMap,8ul>>>,(anonymous_namespace)::PulseCapture::open(char_const*)::__0>
                         (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                          in_stack_fffffffffffffe38);
    local_40 = (DevMap *)
               std::
               vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
               ::cend((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                       *)in_stack_fffffffffffffe18);
    bVar2 = __gnu_cxx::operator==
                      (in_stack_fffffffffffffe20,
                       (__normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
                        *)in_stack_fffffffffffffe18);
    if (bVar2) {
      pbVar10 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception
                (pbVar10,0xa004,"Device name \"%s\" not found",local_10);
      __cxa_throw(pbVar10,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception
                 );
    }
    __gnu_cxx::
    __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
    ::operator->(&local_20);
    local_18 = (char *)std::__cxx11::string::c_str();
    pDVar6 = __gnu_cxx::
             __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
             ::operator->(&local_20);
    std::__cxx11::string::operator=
              ((string *)&((this->super_BackendBase).mDevice)->DeviceName,(string *)pDVar6);
  }
  chanmap_00 = (pa_channel_map *)&this->mMainloop;
  type = (BackendType)local_60;
  PulseMainloop::getUniqueLock(in_stack_fffffffffffffe18);
  rhs = (pa_stream_flags_t)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  ppVar7 = PulseMainloop::connectContext(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  this->mContext = ppVar7;
  pcVar12 = (char *)0x0;
  pPVar18 = (PulseMainloop *)0x0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8._M_device = (mutex_type *)0x0;
  local_e8._M_owns = false;
  local_e8._9_7_ = 0;
  local_68 = 0;
  spec = (pa_sample_spec *)(ulong)((this->super_BackendBase).mDevice)->FmtChans;
  switch(spec) {
  case (pa_sample_spec *)0x0:
    memcpy(&local_e8,(anonymous_namespace)::MonoChanMap,0x84);
    break;
  case (pa_sample_spec *)0x1:
    memcpy(&local_e8,(anonymous_namespace)::StereoChanMap,0x84);
    break;
  case (pa_sample_spec *)0x2:
    memcpy(&local_e8,(anonymous_namespace)::QuadChanMap,0x84);
    break;
  case (pa_sample_spec *)0x3:
    memcpy(&local_e8,(anonymous_namespace)::X51ChanMap,0x84);
    break;
  case (pa_sample_spec *)0x4:
    memcpy(&local_e8,(anonymous_namespace)::X61ChanMap,0x84);
    break;
  case (pa_sample_spec *)0x5:
    memcpy(&local_e8,(anonymous_namespace)::X71ChanMap,0x84);
    break;
  case (pa_sample_spec *)0x6:
    pbVar8 = (backend_exception *)__cxa_allocate_exception(0x30);
    pbVar10 = pbVar8;
    pAVar9 = DevFmtChannelsString(((this->super_BackendBase).mDevice)->FmtChans);
    al::backend_exception::backend_exception(pbVar10,0xa004,"%s capture not supported",pAVar9);
    __cxa_throw(pbVar8,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  case (pa_sample_spec *)0x7:
    memcpy(&local_e8,(anonymous_namespace)::X51RearChanMap,0x84);
  }
  SetChannelOrderFromMap(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  uVar13 = (ulong)((this->super_BackendBase).mDevice)->FmtType;
  switch(uVar13) {
  case 0:
  case 3:
  case 5:
    pbVar8 = (backend_exception *)__cxa_allocate_exception(0x30);
    pbVar10 = pbVar8;
    pAVar9 = DevFmtTypeString(((this->super_BackendBase).mDevice)->FmtType);
    al::backend_exception::backend_exception
              (pbVar10,0xa004,"%s capture samples not supported",pAVar9);
    __cxa_throw(pbVar8,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  case 1:
    this->mSilentVal = 0x80;
    (this->mSpec).format = PA_SAMPLE_U8;
    break;
  case 2:
    (this->mSpec).format = PA_SAMPLE_S16LE;
    break;
  case 4:
    (this->mSpec).format = PA_SAMPLE_S32LE;
    break;
  case 6:
    (this->mSpec).format = PA_SAMPLE_FLOAT32LE;
  }
  (this->mSpec).rate = ((this->super_BackendBase).mDevice)->Frequency;
  AVar3 = ALCdevice::channelsFromFmt((ALCdevice *)0x247dab);
  flags_00 = (pa_stream_flags_t)(uVar13 >> 0x20);
  (this->mSpec).channels = (uint8_t)AVar3;
  iVar4 = (*(anonymous_namespace)::ppa_sample_spec_valid)(&this->mSpec);
  if (iVar4 != 0) {
    iVar4 = (*(anonymous_namespace)::ppa_frame_size)(&this->mSpec);
    pAVar1 = (this->super_BackendBase).mDevice;
    uVar5 = maxu(pAVar1->BufferSize,(pAVar1->Frequency * 100) / 1000);
    (this->mAttr).minreq = 0xffffffff;
    (this->mAttr).prebuf = 0xffffffff;
    (this->mAttr).maxlength = uVar5 * iVar4;
    (this->mAttr).tlength = 0xffffffff;
    uVar5 = minu(uVar5,(((this->super_BackendBase).mDevice)->Frequency * 0x32) / 1000);
    (this->mAttr).fragsize = uVar5 * iVar4;
    operator|(PA_STREAM_START_CORKED,PA_STREAM_ADJUST_LATENCY);
    iVar4 = GetConfigValueBool(in_stack_fffffffffffffe38.name,(char *)in_stack_fffffffffffffe30,
                               (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
                               ,(int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
    if (iVar4 == 0) {
      operator|=((pa_stream_flags_t *)in_stack_fffffffffffffe20,rhs);
    }
    if (2 < (int)gLogLevel) {
      pcVar17 = local_18;
      if (local_18 == (char *)0x0) {
        pcVar17 = "(default)";
      }
      fprintf((FILE *)gLogFile,"[ALSOFT] (II) Connecting to \"%s\"\n",pcVar17);
    }
    plock_00 = &local_e8;
    uVar15 = 1;
    ppVar11 = PulseMainloop::connectStream
                        (pPVar18,pcVar12,(unique_lock<std::mutex> *)in_stack_fffffffffffffeb0,
                         (pa_context *)in_stack_fffffffffffffea8,flags_00,in_stack_fffffffffffffe98,
                         spec,chanmap_00,type);
    this->mStream = ppVar11;
    (*(anonymous_namespace)::ppa_stream_set_moved_callback)(this->mStream,streamMovedCallbackC);
    (*(anonymous_namespace)::ppa_stream_set_state_callback)(this->mStream,streamStateCallbackC);
    pcVar12 = (char *)(*(anonymous_namespace)::ppa_stream_get_device_name)(this->mStream);
    std::__cxx11::string::operator=((string *)&this->mDeviceName,pcVar12);
    uVar13 = std::__cxx11::string::empty();
    if ((uVar13 & 1) != 0) {
      pPVar18 = (PulseMainloop *)this->mContext;
      pcVar16 = (anonymous_namespace)::ppa_context_get_source_info_by_name;
      uVar14 = std::__cxx11::string::c_str();
      (*pcVar16)(pPVar18,uVar14,sourceNameCallbackC,this);
      PulseMainloop::waitForOperation
                (pPVar18,(pa_operation *)CONCAT44(in_stack_fffffffffffffe2c,uVar15),plock_00);
    }
    std::unique_lock<std::mutex>::~unique_lock(plock_00);
    return extraout_EAX;
  }
  pbVar10 = (backend_exception *)__cxa_allocate_exception(0x30);
  al::backend_exception::backend_exception(pbVar10,0xa004,"Invalid sample format");
  __cxa_throw(pbVar10,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
}

Assistant:

void PulseCapture::open(const ALCchar *name)
{
    const char *pulse_name{nullptr};
    if(name)
    {
        if(CaptureDevices.empty())
            mMainloop.probeCaptureDevices();

        auto iter = std::find_if(CaptureDevices.cbegin(), CaptureDevices.cend(),
            [name](const DevMap &entry) -> bool { return entry.name == name; });
        if(iter == CaptureDevices.cend())
            throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};
        pulse_name = iter->device_name.c_str();
        mDevice->DeviceName = iter->name;
    }

    auto plock = mMainloop.getUniqueLock();
    mContext = mMainloop.connectContext(plock);

    pa_channel_map chanmap{};
    switch(mDevice->FmtChans)
    {
    case DevFmtMono:
        chanmap = MonoChanMap;
        break;
    case DevFmtStereo:
        chanmap = StereoChanMap;
        break;
    case DevFmtQuad:
        chanmap = QuadChanMap;
        break;
    case DevFmtX51:
        chanmap = X51ChanMap;
        break;
    case DevFmtX51Rear:
        chanmap = X51RearChanMap;
        break;
    case DevFmtX61:
        chanmap = X61ChanMap;
        break;
    case DevFmtX71:
        chanmap = X71ChanMap;
        break;
    case DevFmtAmbi3D:
        throw al::backend_exception{ALC_INVALID_VALUE, "%s capture not supported",
            DevFmtChannelsString(mDevice->FmtChans)};
    }
    SetChannelOrderFromMap(mDevice, chanmap);

    switch(mDevice->FmtType)
    {
    case DevFmtUByte:
        mSilentVal = al::byte(0x80);
        mSpec.format = PA_SAMPLE_U8;
        break;
    case DevFmtShort:
        mSpec.format = PA_SAMPLE_S16NE;
        break;
    case DevFmtInt:
        mSpec.format = PA_SAMPLE_S32NE;
        break;
    case DevFmtFloat:
        mSpec.format = PA_SAMPLE_FLOAT32NE;
        break;
    case DevFmtByte:
    case DevFmtUShort:
    case DevFmtUInt:
        throw al::backend_exception{ALC_INVALID_VALUE, "%s capture samples not supported",
            DevFmtTypeString(mDevice->FmtType)};
    }
    mSpec.rate = mDevice->Frequency;
    mSpec.channels = static_cast<uint8_t>(mDevice->channelsFromFmt());
    if(pa_sample_spec_valid(&mSpec) == 0)
        throw al::backend_exception{ALC_INVALID_VALUE, "Invalid sample format"};

    const ALuint frame_size{static_cast<ALuint>(pa_frame_size(&mSpec))};
    const ALuint samples{maxu(mDevice->BufferSize, 100 * mDevice->Frequency / 1000)};
    mAttr.minreq = ~0u;
    mAttr.prebuf = ~0u;
    mAttr.maxlength = samples * frame_size;
    mAttr.tlength = ~0u;
    mAttr.fragsize = minu(samples, 50*mDevice->Frequency/1000) * frame_size;

    pa_stream_flags_t flags{PA_STREAM_START_CORKED | PA_STREAM_ADJUST_LATENCY};
    if(!GetConfigValueBool(nullptr, "pulse", "allow-moves", 1))
        flags |= PA_STREAM_DONT_MOVE;

    TRACE("Connecting to \"%s\"\n", pulse_name ? pulse_name : "(default)");
    mStream = mMainloop.connectStream(pulse_name, plock, mContext, flags, &mAttr, &mSpec, &chanmap,
        BackendType::Capture);

    pa_stream_set_moved_callback(mStream, &PulseCapture::streamMovedCallbackC, this);
    pa_stream_set_state_callback(mStream, &PulseCapture::streamStateCallbackC, this);

    mDeviceName = pa_stream_get_device_name(mStream);
    if(mDevice->DeviceName.empty())
    {
        pa_operation *op{pa_context_get_source_info_by_name(mContext, mDeviceName.c_str(),
            &PulseCapture::sourceNameCallbackC, this)};
        mMainloop.waitForOperation(op, plock);
    }
}